

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O1

void __thiscall boost::deflate::error_test::check(error_test *this,char *name,error ev)

{
  long *plVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  error_category *peVar3;
  error_code eVar4;
  error_code ec;
  allocator<char> local_61;
  long *local_60;
  long local_58;
  long local_50 [2];
  error_code local_40;
  
  local_40 = make_error_code(ev);
  eVar4 = make_error_code(0);
  plVar1 = test_suite::detail::current()::p;
  peVar3 = eVar4.cat_;
  iVar2 = (**(local_40.cat_)->_vptr_error_category)();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,(char *)CONCAT44(extraout_var,iVar2),&local_61);
  iVar2 = std::__cxx11::string::compare((char *)&local_60);
  (**(code **)(*plVar1 + 0x28 + (ulong)(iVar2 != 0) * 8))
            (plVar1,"std::string{ec.category().name()} == name",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/error.cpp"
             ,0x1b,"void boost::deflate::error_test::check(const char *, error)");
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  plVar1 = test_suite::detail::current()::p;
  (*(local_40.cat_)->_vptr_error_category[4])(&local_60,local_40.cat_,(ulong)(uint)local_40.val_);
  (**(code **)(*plVar1 + 0x28 + (ulong)(local_58 == 0) * 8))
            (plVar1,"! ec.message().empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/error.cpp"
             ,0x1c,"void boost::deflate::error_test::check(const char *, error)");
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  (**(code **)(*test_suite::detail::current()::p + 0x28 + (ulong)(local_40.cat_ != peVar3) * 8))
            (test_suite::detail::current()::p,"std::addressof(ec.category()) == std::addressof(cat)"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/error.cpp"
             ,0x1e,"void boost::deflate::error_test::check(const char *, error)");
  plVar1 = test_suite::detail::current()::p;
  iVar2 = (*(local_40.cat_)->_vptr_error_category[1])(local_40.cat_,(ulong)ev);
  local_60 = (long *)CONCAT44(extraout_var_00,iVar2);
  iVar2 = (*peVar3->_vptr_error_category[2])(peVar3,(ulong)ev,&local_60);
  (**(code **)(*plVar1 + 0x28 + (ulong)(byte)((byte)iVar2 ^ 1) * 8))
            (plVar1,
             "cat.equivalent( static_cast<std::underlying_type<error>::type>(ev), ec.category().default_error_condition( static_cast<std::underlying_type<error>::type>(ev)))"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/error.cpp"
             ,0x22,"void boost::deflate::error_test::check(const char *, error)");
  plVar1 = test_suite::detail::current()::p;
  iVar2 = (*peVar3->_vptr_error_category[3])(peVar3,&local_40,(ulong)ev);
  (**(code **)(*plVar1 + 0x28 + (ulong)(byte)((byte)iVar2 ^ 1) * 8))
            (plVar1,"cat.equivalent(ec, static_cast<std::underlying_type<error>::type>(ev))",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/error.cpp"
             ,0x24,"void boost::deflate::error_test::check(const char *, error)");
  return;
}

Assistant:

void check(char const* name, error ev)
    {
        auto const ec = make_error_code(ev);
        auto const& cat = make_error_code(
            static_cast<deflate::error>(0)).category();
        BOOST_TEST(std::string{ec.category().name()} == name);
        BOOST_TEST(! ec.message().empty());
        BOOST_TEST(
            std::addressof(ec.category()) == std::addressof(cat));
        BOOST_TEST(cat.equivalent(
            static_cast<std::underlying_type<error>::type>(ev),
                ec.category().default_error_condition(
                    static_cast<std::underlying_type<error>::type>(ev))));
        BOOST_TEST(cat.equivalent(ec,
            static_cast<std::underlying_type<error>::type>(ev)));
    }